

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

bool argagg::is_valid_flag_definition(char *s)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong in_RAX;
  size_t sVar5;
  char *__s;
  char cVar6;
  bool is_long;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  sVar5 = strlen(s);
  uVar2 = uStack_28;
  if ((sVar5 < 2) || (*s != '-')) {
LAB_0013ccd6:
    bVar3 = false;
  }
  else {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    cVar1 = s[1];
    if (cVar1 == '-') {
      uStack_28 = CONCAT17(1,(int7)uVar2);
      if (sVar5 == 2) goto LAB_0013ccd6;
      __s = s + 2;
      cVar6 = s[2];
    }
    else {
      __s = s + 1;
      cVar6 = cVar1;
    }
    sVar5 = strlen(__s);
    iVar4 = isalnum((int)cVar6);
    bVar3 = false;
    if ((iVar4 != 0) && (cVar1 == '-' || sVar5 < 2)) {
      bVar3 = std::
              all_of<char_const*,argagg::is_valid_flag_definition(char_const*)::_lambda(char_const&)_1_>
                        (__s + 1,__s + sVar5,(bool *)((long)&uStack_28 + 7));
    }
  }
  return bVar3;
}

Assistant:

inline
bool is_valid_flag_definition(
  const char* s)
{
  auto len = std::strlen(s);

  // The shortest possible flag has two characters: a hyphen and an
  // alpha-numeric character.
  if (len < 2) {
    return false;
  }

  // All flags must start with a hyphen.
  if (s[0] != '-') {
    return false;
  }

  // Shift the name forward by a character to account for the initial hyphen.
  // This means if s was originally "-v" then name will be "v".
  const char* name = s + 1;

  // Check if we're dealing with a long flag.
  bool is_long = false;
  if (s[1] == '-') {
    is_long = true;

    // Just -- is not a valid flag.
    if (len == 2) {
      return false;
    }

    // Shift the name forward to account for the extra hyphen. This means if s
    // was originally "--output" then name will be "output".
    name = s + 2;
  }

  // The first character of the flag name must be alpha-numeric. This is to
  // prevent things like "---a" from being valid flags.
  len = std::strlen(name);
  if (!std::isalnum(name[0])) {
    return false;
  }

  // If this is a short flag then it must only have one character.
  if (!is_long && len > 1) {
    return false;
  }

  // The rest of the characters must be alpha-numeric, but long flags are
  // allowed to have hyphens too.
  return std::all_of(name + 1, name + len, [&](const char& c) {
      return std::isalnum(c) || (c == '-' && is_long);
    });
}